

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

void __thiscall OpenMD::Stats::parseStatFileFormat(Stats *this,string *format)

{
  StatsMapType *this_00;
  _Rb_tree_color _Var1;
  StatsMapType *pSVar2;
  bool bVar3;
  iterator iVar4;
  string token;
  StringTokenizer tokenizer;
  string local_b8;
  Stats *local_98;
  locale local_90 [8];
  StringTokenizer local_88;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," ,;|\t\n\r","");
  StringTokenizer::StringTokenizer(&local_88,format,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &local_98->statsMap_;
  pSVar2 = &local_98->statsMap_;
  do {
    bVar3 = StringTokenizer::hasMoreTokens(&local_88);
    if (!bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
        operator_delete(local_88.delim_._M_dataplus._M_p,
                        local_88.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
        operator_delete(local_88.tokenString_._M_dataplus._M_p,
                        local_88.tokenString_.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    StringTokenizer::nextToken_abi_cxx11_(&local_b8,&local_88);
    std::locale::locale(local_90);
    toUpper<std::__cxx11::string>(&local_b8,local_90);
    std::locale::~locale(local_90);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
            ::find(&this_00->_M_t,&local_b8);
    if ((_Rb_tree_header *)iVar4._M_node == &(pSVar2->_M_t)._M_impl.super__Rb_tree_header) {
      snprintf(painCave.errMsg,2000,
               "Stats::parseStatFileFormat: %s is not a recognized\n\tstatFileFormat keyword.\n",
               local_b8._M_dataplus._M_p);
      painCave.isFatal = 0;
      painCave.severity = 1;
      simError();
    }
    else {
      _Var1 = iVar4._M_node[2]._M_color;
      if (0x2d < (ulong)_Var1) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)_Var1,
                   0x2e);
      }
      (local_98->statsMask_).super__Base_bitset<1UL>._M_w =
           (local_98->statsMask_).super__Base_bitset<1UL>._M_w | 1L << ((byte)_Var1 & 0x3f);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void Stats::parseStatFileFormat(const std::string& format) {
    StringTokenizer tokenizer(format, " ,;|\t\n\r");

    while (tokenizer.hasMoreTokens()) {
      std::string token(tokenizer.nextToken());
      toUpper(token);
      StatsMapType::iterator i = statsMap_.find(token);
      if (i != statsMap_.end()) {
        statsMask_.set(i->second);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Stats::parseStatFileFormat: %s is not a recognized\n"
                 "\tstatFileFormat keyword.\n",
                 token.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
    }
  }